

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_BaseModel.cpp
# Opt level: O0

bool __thiscall Opcode::BaseModel::Refit(BaseModel *this)

{
  int iVar1;
  BaseModel *this_local;
  
  iVar1 = (*this->mTree->_vptr_AABBOptimizedTree[3])(this->mTree,this->mIMesh);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool BaseModel::Refit()
{
	// Refit the optimized tree
	return mTree->Refit(mIMesh);

// Old code kept for reference : refit the source tree then rebuild !
//	if(!mSource)	return false;
//	// Ouch...
//	mSource->Refit(&mTB);
//	// Ouch...
//	return mTree->Build(mSource);
}